

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

void __thiscall
validation_block_tests::witness_commitment_index::test_method(witness_commitment_index *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CScript *this_00;
  CScript *this_01;
  CScript *this_02;
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  element_type *peVar2;
  pointer pCVar3;
  size_type sVar4;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> uVar5;
  CTransaction *pCVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  Chainstate *chainstate;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  size_type *psVar11;
  __uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> _Var12;
  CBlock *pCVar13;
  ulong uVar14;
  char *pcVar15;
  iterator in_R9;
  long in_FS_OFFSET;
  byte bVar16;
  const_string file;
  const_string msg;
  undefined4 local_2e0;
  int local_2dc;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  CMutableTransaction txCoinbase;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> ptemplate;
  undefined4 *local_258;
  undefined **local_250;
  undefined1 local_248;
  undefined1 *local_240;
  undefined4 **local_238;
  int *local_230;
  CTransaction *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  undefined1 *local_218;
  int **local_210;
  char *local_200;
  __node_base_ptr local_1f8;
  assertion_result local_1f0;
  Options options;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  CTxOut invalid;
  CTxOut min_plus_one;
  CTxOut witness;
  CBlock pblock;
  CScript pubKey;
  
  bVar16 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  pcVar15 = "m_node.chainman";
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0x14a,"test_method","m_node.chainman");
  criticalblock22.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock22.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock22.super_unique_lock);
  pubKey.super_CScriptBase._union._16_8_ = 0;
  pubKey.super_CScriptBase._24_8_ = 0;
  pubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  pubKey.super_CScriptBase._union._8_8_ = 0;
  pblock.super_CBlockHeader.nVersion._0_1_ = 0x51;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)&pubKey.super_CScriptBase,
             (uchar *)&pblock);
  uVar8 = pubKey.super_CScriptBase._union.indirect_contents.indirect;
  sVar4 = pubKey.super_CScriptBase._size - 0x1d;
  if (pubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &pubKey.super_CScriptBase;
    sVar4 = pubKey.super_CScriptBase._size;
  }
  pblock.super_CBlockHeader.nVersion._0_1_ = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (&pubKey.super_CScriptBase,
             (uchar *)((long)&((prevector<28U,_unsigned_char,_unsigned_int,_int> *)uVar8)->_union +
                      (long)(int)sVar4),(uchar *)&pblock);
  options.super_BlockCreateOptions.use_mempool = true;
  options.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  options.nBlockMaxWeight = 0x3cf960;
  options.blockMinFeeRate.nSatoshisPerK = 1000;
  options.test_block_validity = true;
  options.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((val->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)&pblock,chainstate,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&options);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&ptemplate,(CScript *)&pblock);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(pblock.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems +
                   4));
  if ((CBlockTemplate *)
      CONCAT71(pblock.super_CBlockHeader._1_7_,(undefined1)pblock.super_CBlockHeader.nVersion) !=
      (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)&pblock,
               (CBlockTemplate *)
               CONCAT71(pblock.super_CBlockHeader._1_7_,
                        (undefined1)pblock.super_CBlockHeader.nVersion));
  }
  uVar5._M_t.super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
  ._M_t.super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       ptemplate._M_t.
       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
       super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl;
  _Var12._M_t.
  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
  super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
       (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
       (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
       ptemplate._M_t.
       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
       super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl;
  pCVar13 = &pblock;
  for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar8 = *(undefined8 *)
             _Var12._M_t.
             super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
             .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl;
    (pCVar13->super_CBlockHeader).nVersion = (int)uVar8;
    (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar8 >> 0x20);
    (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar8 >> 0x28);
    (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar8 >> 0x30);
    (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar8 >> 0x38);
    _Var12._M_t.
    super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
    super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl =
         (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
         (tuple<node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>)
         ((undefined8 *)
          ((long)_Var12._M_t.
                 super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                 .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 8) +
         (ulong)bVar16 * -2);
    pCVar13 = (CBlock *)((long)pCVar13 + (ulong)bVar16 * -0x10 + 8);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&pblock.vtx,
           (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)((long)ptemplate._M_t.
                     super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                     .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x50));
  pblock.m_checked_merkle_root =
       *(bool *)((long)uVar5._M_t.
                       super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                       .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x6a);
  pblock._104_2_ =
       *(undefined2 *)
        ((long)uVar5._M_t.
               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x68);
  CTxOut::CTxOut(&witness);
  this_00 = &witness.scriptPubKey;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&this_00->super_CScriptBase,0x26);
  uVar8 = this_00;
  if (0x1c < witness.scriptPubKey.super_CScriptBase._size) {
    uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  (((CScript *)uVar8)->super_CScriptBase)._union.direct[0] = 'j';
  uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar8 + 1) = '$';
  uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar8 + 2) = -0x56;
  uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar8 + 3) = '!';
  uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar8 + 4) = -0x57;
  uVar8 = witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (witness.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar8 = &witness.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar8 + 5) = -0x13;
  this_01 = &min_plus_one.scriptPubKey;
  min_plus_one.nValue = witness.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&this_01->super_CScriptBase,&this_00->super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&this_01->super_CScriptBase,0x27);
  this_02 = &invalid.scriptPubKey;
  invalid.nValue = witness.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&this_02->super_CScriptBase,&this_00->super_CScriptBase);
  uVar8 = this_02;
  if (0x1c < invalid.scriptPubKey.super_CScriptBase._size) {
    uVar8 = invalid.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  (((CScript *)uVar8)->super_CScriptBase)._union.direct[0] = 'i';
  CMutableTransaction::CMutableTransaction
            (&txCoinbase,
             ((pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txCoinbase.vout,4);
  (txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = witness.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &this_00->super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[1].nValue = witness.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &this_00->super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[2].nValue = min_plus_one.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             &this_01->super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[3].nValue = invalid.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase,
             &this_02->super_CScriptBase);
  local_228 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&_Stack_220,&local_228,(allocator<CTransaction> *)&local_250,&txCoinbase);
  _Var7._M_pi = _Stack_220._M_pi;
  pCVar6 = local_228;
  local_228 = (CTransaction *)0x0;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_03 = ((pblock.vtx.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  ((pblock.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar6;
  ((pblock.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var7._M_pi;
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x169;
  file.m_begin = (iterator)&local_2a8;
  msg.m_end = in_R9;
  msg.m_begin = pcVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  uVar10 = 0xffffffff;
  local_2dc = -1;
  if (pblock.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      pblock.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar2 = ((pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar3;
    if (lVar9 != 0) {
      lVar9 = (lVar9 >> 3) * -0x3333333333333333;
      psVar11 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
      uVar14 = 0;
      do {
        if ((((0x42 < *psVar11) &&
             (pcVar15 = *(char **)&((CScriptBase *)(psVar11 + -7))->_union, *pcVar15 == 'j')) &&
            (pcVar15[1] == '$')) &&
           (((pcVar15[2] == -0x56 && (pcVar15[3] == '!')) &&
            ((pcVar15[4] == -0x57 && (pcVar15[5] == -0x13)))))) {
          uVar10 = uVar14 & 0xffffffff;
        }
        local_2dc = (int)uVar10;
        uVar14 = uVar14 + 1;
        psVar11 = psVar11 + 10;
      } while (lVar9 + (ulong)(lVar9 == 0) != uVar14);
    }
  }
  local_230 = &local_2dc;
  local_258 = &local_2e0;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_2dc == 2);
  local_2e0 = 2;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_1f8 = (__node_base_ptr)0xfa12f3;
  local_210 = &local_230;
  _Stack_220._M_pi = _Stack_220._M_pi & 0xffffffffffffff00;
  local_228 = (CTransaction *)&PTR__lazy_ostream_013d3e70;
  local_218 = boost::unit_test::lazy_ostream::inst;
  local_238 = &local_258;
  local_248 = 0;
  local_250 = &PTR__lazy_ostream_013d3e70;
  local_240 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_2d8,1,2,REQUIRE,0xfa1ccc,(size_t)&local_200,0x169,&local_228,"2",
             (allocator<CTransaction> *)&local_250);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txCoinbase.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txCoinbase.vin);
  if (0x1c < invalid.scriptPubKey.super_CScriptBase._size) {
    free(invalid.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    invalid.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < min_plus_one.scriptPubKey.super_CScriptBase._size) {
    free(min_plus_one.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    min_plus_one.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < witness.scriptPubKey.super_CScriptBase._size) {
    free(witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    witness.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&pblock.vtx);
  if ((__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)
      ptemplate._M_t.
      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>._M_t.
      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>.
      super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)&ptemplate,
               (CBlockTemplate *)
               ptemplate._M_t.
               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  }
  if (0x1c < pubKey.super_CScriptBase._size) {
    free(pubKey.super_CScriptBase._union.indirect_contents.indirect);
    pubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(witness_commitment_index)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    CScript pubKey;
    pubKey << 1 << OP_TRUE;
    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(pubKey);
    CBlock pblock = ptemplate->block;

    CTxOut witness;
    witness.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
    witness.scriptPubKey[0] = OP_RETURN;
    witness.scriptPubKey[1] = 0x24;
    witness.scriptPubKey[2] = 0xaa;
    witness.scriptPubKey[3] = 0x21;
    witness.scriptPubKey[4] = 0xa9;
    witness.scriptPubKey[5] = 0xed;

    // A witness larger than the minimum size is still valid
    CTxOut min_plus_one = witness;
    min_plus_one.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT + 1);

    CTxOut invalid = witness;
    invalid.scriptPubKey[0] = OP_VERIFY;

    CMutableTransaction txCoinbase(*pblock.vtx[0]);
    txCoinbase.vout.resize(4);
    txCoinbase.vout[0] = witness;
    txCoinbase.vout[1] = witness;
    txCoinbase.vout[2] = min_plus_one;
    txCoinbase.vout[3] = invalid;
    pblock.vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    BOOST_CHECK_EQUAL(GetWitnessCommitmentIndex(pblock), 2);
}